

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O0

void anon_unknown.dwarf_5c0f::check_file_sanity(string *path,Expectation expected,mode_t perms)

{
  __mode_t _Var1;
  bool bVar2;
  int iVar3;
  __uid_t _Var4;
  __gid_t _Var5;
  char *pcVar6;
  ostream *poVar7;
  int *piVar8;
  void *this;
  LogFatal local_9e8;
  LogFatal local_860;
  LogFatal local_6d8;
  LogFatal local_550;
  LogFatal local_3c8;
  LogFatal local_230;
  undefined1 local_a8 [8];
  stat st;
  mode_t perms_local;
  Expectation expected_local;
  string *path_local;
  
  st.__glibc_reserved[2]._0_4_ = perms;
  st.__glibc_reserved[2]._4_4_ = expected;
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar3 = stat(pcVar6,(stat *)local_a8);
  if (iVar3 != 0) {
    memset(&local_230,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_230);
    poVar7 = tools::xar::detail::LogFatal::stream(&local_230);
    poVar7 = std::operator<<(poVar7,"FATAL ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x57);
    poVar7 = std::operator<<(poVar7,": ");
    poVar7 = std::operator<<(poVar7,"stat(path.c_str(), &st) == 0");
    poVar7 = std::operator<<(poVar7,": ");
    piVar8 = __errno_location();
    pcVar6 = strerror(*piVar8);
    std::operator<<(poVar7,pcVar6);
    tools::xar::detail::LogFatal::~LogFatal(&local_230);
  }
  _Var4 = geteuid();
  _Var1 = st.st_mode;
  if (st.st_nlink._4_4_ != _Var4) {
    memset(&local_3c8,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_3c8);
    poVar7 = tools::xar::detail::LogFatal::stream(&local_3c8);
    poVar7 = std::operator<<(poVar7,"FATAL ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x59);
    poVar7 = std::operator<<(poVar7,": ");
    poVar7 = std::operator<<(poVar7,"Invalid owner of ");
    std::operator<<(poVar7,(string *)path);
    tools::xar::detail::LogFatal::~LogFatal(&local_3c8);
  }
  _Var5 = getegid();
  if (_Var1 != _Var5) {
    bVar2 = tools::xar::is_user_in_group(st.st_mode);
    if (!bVar2) {
      memset(&local_550,0,0x188);
      tools::xar::detail::LogFatal::LogFatal(&local_550);
      poVar7 = tools::xar::detail::LogFatal::stream(&local_550);
      poVar7 = std::operator<<(poVar7,"FATAL ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5e);
      poVar7 = std::operator<<(poVar7,": ");
      poVar7 = std::operator<<(poVar7,"Invalid group of ");
      std::operator<<(poVar7,(string *)path);
      tools::xar::detail::LogFatal::~LogFatal(&local_550);
    }
  }
  if ((st.__glibc_reserved[2]._4_4_ == Directory) && (((uint)st.st_nlink & 0xf000) != 0x4000)) {
    memset(&local_6d8,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_6d8);
    poVar7 = tools::xar::detail::LogFatal::stream(&local_6d8);
    poVar7 = std::operator<<(poVar7,"FATAL ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x62);
    poVar7 = std::operator<<(poVar7,": ");
    poVar7 = std::operator<<(poVar7,"Should be a directory: ");
    std::operator<<(poVar7,(string *)path);
    tools::xar::detail::LogFatal::~LogFatal(&local_6d8);
  }
  if ((st.__glibc_reserved[2]._4_4_ == File) && (((uint)st.st_nlink & 0xf000) != 0x8000)) {
    memset(&local_860,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_860);
    poVar7 = tools::xar::detail::LogFatal::stream(&local_860);
    poVar7 = std::operator<<(poVar7,"FATAL ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x65);
    poVar7 = std::operator<<(poVar7,": ");
    poVar7 = std::operator<<(poVar7,"Should be a normal file: ");
    std::operator<<(poVar7,(string *)path);
    tools::xar::detail::LogFatal::~LogFatal(&local_860);
  }
  if (((uint)st.st_nlink & 0xfff) != (mode_t)st.__glibc_reserved[2]) {
    memset(&local_9e8,0,0x188);
    tools::xar::detail::LogFatal::LogFatal(&local_9e8);
    poVar7 = tools::xar::detail::LogFatal::stream(&local_9e8);
    poVar7 = std::operator<<(poVar7,"FATAL ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x68);
    poVar7 = std::operator<<(poVar7,": ");
    poVar7 = std::operator<<(poVar7,"Invalid permissions on ");
    poVar7 = std::operator<<(poVar7,(string *)path);
    poVar7 = std::operator<<(poVar7,", expected ");
    this = (void *)std::ostream::operator<<(poVar7,std::oct);
    poVar7 = (ostream *)std::ostream::operator<<(this,(mode_t)st.__glibc_reserved[2]);
    poVar7 = std::operator<<(poVar7,", got ");
    std::ostream::operator<<(poVar7,(uint)st.st_nlink & 0xfff);
    tools::xar::detail::LogFatal::~LogFatal(&local_9e8);
  }
  return;
}

Assistant:

void check_file_sanity(
    const std::string& path,
    enum Expectation expected,
    mode_t perms) {
  struct stat st;
  XAR_PCHECK_SIMPLE(stat(path.c_str(), &st) == 0);
  if (st.st_uid != geteuid()) {
    XAR_FATAL << "Invalid owner of " << path;
  }

  // Verify the directory is owned by one of the groups the user is in.
  if (st.st_gid != getegid() && !tools::xar::is_user_in_group(st.st_gid)) {
    XAR_FATAL << "Invalid group of " << path;
  }

  if (expected == Expectation::Directory && !S_ISDIR(st.st_mode)) {
    XAR_FATAL << "Should be a directory: " << path;
  }
  if (expected == Expectation::File && !S_ISREG(st.st_mode)) {
    XAR_FATAL << "Should be a normal file: " << path;
  }
  if ((st.st_mode & 07777) != perms) {
    XAR_FATAL << "Invalid permissions on " << path << ", expected " << std::oct
              << perms << ", got " << (st.st_mode & 07777);
  }
}